

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::ComputeAbsoluteTransform(PretransformVertices *this,aiNode *pcNode)

{
  aiNode *paVar1;
  uint i;
  ulong uVar2;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> local_58;
  
  paVar1 = pcNode->mParent;
  if (paVar1 != (aiNode *)0x0) {
    local_58.a1 = (paVar1->mTransformation).a1;
    local_58.a2 = (paVar1->mTransformation).a2;
    local_58.a3 = (paVar1->mTransformation).a3;
    local_58.a4 = (paVar1->mTransformation).a4;
    local_58.b1 = (paVar1->mTransformation).b1;
    local_58.b2 = (paVar1->mTransformation).b2;
    local_58.b3 = (paVar1->mTransformation).b3;
    local_58.b4 = (paVar1->mTransformation).b4;
    local_58.c1 = (paVar1->mTransformation).c1;
    local_58.c2 = (paVar1->mTransformation).c2;
    local_58.c3 = (paVar1->mTransformation).c3;
    local_58.c4 = (paVar1->mTransformation).c4;
    local_58.d1 = (paVar1->mTransformation).d1;
    local_58.d2 = (paVar1->mTransformation).d2;
    local_58.d3 = (paVar1->mTransformation).d3;
    local_58.d4 = (paVar1->mTransformation).d4;
    aiMatrix4x4t<float>::operator*=(&local_58,&pcNode->mTransformation);
    (pcNode->mTransformation).a1 = local_58.a1;
    (pcNode->mTransformation).a2 = local_58.a2;
    (pcNode->mTransformation).a3 = local_58.a3;
    (pcNode->mTransformation).a4 = local_58.a4;
    (pcNode->mTransformation).b1 = local_58.b1;
    (pcNode->mTransformation).b2 = local_58.b2;
    (pcNode->mTransformation).b3 = local_58.b3;
    (pcNode->mTransformation).b4 = local_58.b4;
    (pcNode->mTransformation).c1 = local_58.c1;
    (pcNode->mTransformation).c2 = local_58.c2;
    (pcNode->mTransformation).c3 = local_58.c3;
    (pcNode->mTransformation).c4 = local_58.c4;
    (pcNode->mTransformation).d1 = local_58.d1;
    (pcNode->mTransformation).d2 = local_58.d2;
    (pcNode->mTransformation).d3 = local_58.d3;
    (pcNode->mTransformation).d4 = local_58.d4;
  }
  for (uVar2 = 0; uVar2 < pcNode->mNumChildren; uVar2 = uVar2 + 1) {
    ComputeAbsoluteTransform(this,pcNode->mChildren[uVar2]);
  }
  return;
}

Assistant:

void PretransformVertices::ComputeAbsoluteTransform(aiNode *pcNode) {
	if (pcNode->mParent) {
		pcNode->mTransformation = pcNode->mParent->mTransformation * pcNode->mTransformation;
	}

	for (unsigned int i = 0; i < pcNode->mNumChildren; ++i) {
		ComputeAbsoluteTransform(pcNode->mChildren[i]);
	}
}